

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void set_want_move_all_wins(Am_Object *root_window,bool want_move)

{
  bool bVar1;
  Am_Value *this;
  bool local_82;
  Am_Object local_68;
  byte local_59;
  Am_Object local_58;
  Am_Instance_Iterator local_50;
  Am_Object win;
  Am_Object local_30;
  undefined1 local_28 [8];
  Am_Instance_Iterator instance_iter;
  bool want_move_local;
  Am_Object *root_window_local;
  
  instance_iter.prototype.data._7_1_ = want_move;
  Am_Object::Am_Object(&local_30,root_window);
  Am_Instance_Iterator::Am_Instance_Iterator((Am_Instance_Iterator *)local_28,&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_50.prototype);
  Am_Instance_Iterator::Start((Am_Instance_Iterator *)local_28);
  while (bVar1 = Am_Instance_Iterator::Last((Am_Instance_Iterator *)local_28),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    Am_Instance_Iterator::Get(&local_50);
    Am_Object::operator=(&local_50.prototype,&local_50.current);
    Am_Object::~Am_Object(&local_50.current);
    local_59 = 0;
    this = Am_Object::Get(&local_50.prototype,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    local_82 = false;
    if (bVar1) {
      Am_Object::Get_Owner(&local_58,(Am_Slot_Flags)&local_50.prototype);
      local_59 = 1;
      local_82 = Am_Object::Valid(&local_58);
    }
    if ((local_59 & 1) != 0) {
      Am_Object::~Am_Object(&local_58);
    }
    if (local_82 != false) {
      Am_Object::Am_Object(&local_68,&local_50.prototype);
      set_want_move_one_win(&local_68,(bool)(instance_iter.prototype.data._7_1_ & 1));
      Am_Object::~Am_Object(&local_68);
    }
    set_want_move_all_wins(&local_50.prototype,(bool)(instance_iter.prototype.data._7_1_ & 1));
    Am_Instance_Iterator::Next((Am_Instance_Iterator *)local_28);
  }
  Am_Object::~Am_Object(&local_50.prototype);
  Am_Instance_Iterator::~Am_Instance_Iterator((Am_Instance_Iterator *)local_28);
  return;
}

Assistant:

static void
set_want_move_all_wins(const Am_Object &root_window, bool want_move)
{
  Am_Instance_Iterator instance_iter(root_window);
  Am_Object win;
  for (instance_iter.Start(); !instance_iter.Last(); instance_iter.Next()) {
    win = instance_iter.Get();
    if ((bool)win.Get(Am_VISIBLE) && win.Get_Owner().Valid())
      //just visible windows
      set_want_move_one_win(win, want_move);
    //recurse on instance
    set_want_move_all_wins(win, want_move);
  }
}